

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

bcf_hdr_t * bcf_hdr_subset(bcf_hdr_t *h0,int n,char **samples,int *imap)

{
  khint32_t *pkVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  khint_t kVar7;
  kh_str2int_t *h;
  char *__haystack;
  bcf_hdr_t *hdr;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  byte bVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  khint_t kVar17;
  uint uVar18;
  khint_t kVar19;
  int iVar20;
  kh_str2int_t *hash_1;
  khint_t kVar21;
  kh_str2int_t *hash;
  int hlen;
  ulong local_a0;
  ulong local_88;
  int local_44;
  bcf_hdr_t *local_40;
  ulong local_38;
  
  h = (kh_str2int_t *)calloc(1,0x28);
  __haystack = bcf_hdr_fmt_text(h0,1,&local_44);
  hdr = bcf_hdr_init("w");
  local_40 = h0;
  pcVar8 = bcf_hdr_get_version(h0);
  bcf_hdr_set_version(hdr,pcVar8);
  if (0 < n) {
    memset(imap,0xff,(ulong)(uint)n << 2);
  }
  if (local_40->n[2] < 1) {
    local_a0 = (ulong)local_44;
    uVar14 = local_a0 + 1 >> 1 | local_a0 + 1;
    uVar14 = uVar14 >> 2 | uVar14;
    uVar14 = uVar14 >> 4 | uVar14;
    uVar14 = uVar14 >> 8 | uVar14;
    local_88 = (uVar14 >> 0x10 | uVar14) + 1;
    pcVar8 = (char *)malloc(local_88);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
      local_a0 = 0;
    }
    else {
      memcpy(pcVar8,__haystack,local_a0);
      pcVar8[local_a0] = '\0';
    }
  }
  else {
    uVar16 = 8 - (n == 0);
    pcVar8 = strstr(__haystack,"#CHROM\t");
    pcVar8 = strchr(pcVar8,9);
    uVar18 = 0;
    if (pcVar8 != (char *)0x0) {
      do {
        uVar18 = uVar18 + 1;
        pcVar8 = strchr(pcVar8 + 1,9);
        if (pcVar8 == (char *)0x0) break;
      } while (uVar18 < uVar16);
    }
    if (uVar18 != uVar16) {
      free(hdr);
      return (bcf_hdr_t *)0x0;
    }
    local_a0 = (ulong)((int)pcVar8 - (int)__haystack);
    uVar14 = local_a0 + 1 >> 1 | local_a0 + 1;
    uVar14 = uVar14 >> 2 | uVar14;
    uVar14 = uVar14 >> 4 | uVar14;
    uVar14 = uVar14 >> 8 | uVar14;
    local_88 = (uVar14 >> 0x10 | uVar14) + 1;
    pcVar8 = (char *)malloc(local_88);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
      local_a0 = 0;
    }
    else {
      memcpy(pcVar8,__haystack,local_a0);
      pcVar8[local_a0] = '\0';
    }
    if (0 < n) {
      local_38 = (ulong)(uint)n;
      uVar14 = 0;
      do {
        pcVar12 = samples[uVar14];
        kVar19 = h->n_buckets;
        kVar17 = 0;
        if (kVar19 != 0) {
          uVar16 = (uint)*pcVar12;
          if (*pcVar12 == '\0') {
            uVar16 = 0;
          }
          else {
            cVar3 = pcVar12[1];
            if (cVar3 != '\0') {
              pcVar15 = pcVar12 + 2;
              do {
                uVar16 = (int)cVar3 + uVar16 * 0x1f;
                cVar3 = *pcVar15;
                pcVar15 = pcVar15 + 1;
              } while (cVar3 != '\0');
            }
          }
          uVar16 = uVar16 & kVar19 - 1;
          pkVar1 = h->flags;
          iVar20 = 1;
          uVar18 = uVar16;
          do {
            uVar6 = pkVar1[uVar18 >> 4];
            bVar13 = (char)uVar18 * '\x02' & 0x1e;
            uVar4 = uVar6 >> bVar13;
            if (((uVar4 & 2) != 0) ||
               (((uVar4 & 1) == 0 && (iVar5 = strcmp(h->keys[uVar18],pcVar12), iVar5 == 0)))) {
              kVar17 = uVar18;
              if ((uVar6 >> bVar13 & 3) != 0) {
                kVar17 = kVar19;
              }
              break;
            }
            uVar18 = uVar18 + iVar20 & kVar19 - 1;
            iVar20 = iVar20 + 1;
            kVar17 = kVar19;
          } while (uVar18 != uVar16);
        }
        if (kVar17 != kVar19) {
          fprintf(_stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n",pcVar12);
          free(pcVar8);
          free(__haystack);
          khash_str2int_destroy(h);
          bcf_hdr_destroy(hdr);
          return (bcf_hdr_t *)0x0;
        }
        iVar20 = bcf_hdr_id2int(local_40,2,pcVar12);
        imap[uVar14] = iVar20;
        if (-1 < iVar20) {
          uVar11 = local_a0 + 1;
          pcVar12 = pcVar8;
          if (uVar11 < local_88) {
LAB_0011e41a:
            (pcVar12 + local_a0)[0] = '\t';
            (pcVar12 + local_a0)[1] = '\0';
            local_a0 = uVar11;
            pcVar8 = pcVar12;
          }
          else {
            uVar9 = uVar11 >> 1 | uVar11;
            uVar9 = uVar9 >> 2 | uVar9;
            uVar9 = uVar9 >> 4 | uVar9;
            uVar9 = uVar9 >> 8 | uVar9;
            local_88 = (uVar9 >> 0x10 | uVar9) + 1;
            pcVar12 = (char *)realloc(pcVar8,local_88);
            if (pcVar12 != (char *)0x0) goto LAB_0011e41a;
          }
          pcVar12 = samples[uVar14];
          sVar10 = strlen(pcVar12);
          sVar10 = (size_t)(int)sVar10;
          uVar11 = local_a0 + sVar10 + 1;
          pcVar15 = pcVar8;
          if (uVar11 < local_88) {
LAB_0011e492:
            pcVar8 = pcVar15;
            memcpy(pcVar8 + local_a0,pcVar12,sVar10);
            local_a0 = local_a0 + sVar10;
            pcVar8[local_a0] = '\0';
          }
          else {
            uVar11 = uVar11 >> 1 | uVar11;
            uVar11 = uVar11 >> 2 | uVar11;
            uVar11 = uVar11 >> 4 | uVar11;
            uVar11 = uVar11 >> 8 | uVar11;
            local_88 = (uVar11 >> 0x10 | uVar11) + 1;
            pcVar15 = (char *)realloc(pcVar8,local_88);
            if (pcVar15 != (char *)0x0) goto LAB_0011e492;
          }
          if (h != (kh_str2int_t *)0x0) {
            pcVar12 = samples[uVar14];
            if (h->n_occupied < h->upper_bound) {
LAB_0011e51e:
              uVar16 = (uint)*pcVar12;
              if (*pcVar12 == '\0') {
                uVar16 = 0;
              }
              else {
                cVar3 = pcVar12[1];
                if (cVar3 != '\0') {
                  pcVar15 = pcVar12 + 2;
                  do {
                    uVar16 = (int)cVar3 + uVar16 * 0x1f;
                    cVar3 = *pcVar15;
                    pcVar15 = pcVar15 + 1;
                  } while (cVar3 != '\0');
                }
              }
              kVar19 = h->n_buckets;
              kVar17 = uVar16 & kVar19 - 1;
              pkVar1 = h->flags;
              if ((pkVar1[kVar17 >> 4] >> ((char)kVar17 * '\x02' & 0x1fU) & 2) == 0) {
                iVar20 = 1;
                uVar16 = kVar17;
                kVar21 = kVar19;
                do {
                  uVar18 = pkVar1[uVar16 >> 4];
                  uVar4 = uVar16 * 2 & 0x1e;
                  uVar6 = uVar18 >> (sbyte)uVar4;
                  kVar7 = kVar19;
                  if (((uVar6 & 2) != 0) ||
                     (((uVar6 & 1) == 0 && (iVar5 = strcmp(h->keys[uVar16],pcVar12), iVar5 == 0))))
                  break;
                  if ((uVar18 >> uVar4 & 1) != 0) {
                    kVar21 = uVar16;
                  }
                  uVar16 = uVar16 + iVar20 & kVar19 - 1;
                  iVar20 = iVar20 + 1;
                  kVar7 = kVar21;
                } while (uVar16 != kVar17);
                kVar17 = kVar7;
                if (kVar7 == kVar19) {
                  if (kVar21 == kVar19) {
                    kVar21 = uVar16;
                  }
                  kVar17 = kVar21;
                  if ((pkVar1[uVar16 >> 4] >> ((char)uVar16 * '\x02' & 0x1fU) & 2) == 0) {
                    kVar17 = uVar16;
                  }
                }
              }
              uVar16 = kVar17 >> 4;
              bVar13 = (char)kVar17 * '\x02' & 0x1e;
              if ((pkVar1[uVar16] >> bVar13 & 2) == 0) {
                bVar2 = true;
                if ((pkVar1[uVar16] >> bVar13 & 1) != 0) {
                  h->keys[kVar17] = pcVar12;
                  h->flags[uVar16] = h->flags[uVar16] & ~(3 << bVar13);
                  h->size = h->size + 1;
                  goto LAB_0011e686;
                }
              }
              else {
                h->keys[kVar17] = pcVar12;
                h->flags[uVar16] = h->flags[uVar16] & ~(3 << bVar13);
                h->size = h->size + 1;
                h->n_occupied = h->n_occupied + 1;
                bVar2 = false;
              }
            }
            else {
              uVar16 = h->n_buckets;
              if (h->size * 2 < uVar16) {
                kVar19 = uVar16 - 1;
              }
              else {
                kVar19 = uVar16 + 1;
              }
              iVar20 = kh_resize_str2int(h,kVar19);
              if (-1 < iVar20) goto LAB_0011e51e;
              kVar17 = h->n_buckets;
LAB_0011e686:
              bVar2 = false;
            }
            if (!bVar2) {
              h->vals[kVar17] = h->size - 1;
            }
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_38);
    }
  }
  if (local_a0 != 0) {
    do {
      if ((pcVar8[local_a0 - 1] != '\n') && (pcVar8[local_a0 - 1] != '\0')) goto LAB_0011e713;
      local_a0 = local_a0 - 1;
    } while (local_a0 != 0);
    local_a0 = 0;
  }
LAB_0011e713:
  uVar14 = local_a0 + 1;
  pcVar12 = pcVar8;
  if ((uVar14 < local_88) ||
     (uVar14 = uVar14 >> 1 | uVar14, uVar14 = uVar14 >> 2 | uVar14, uVar14 = uVar14 >> 4 | uVar14,
     uVar14 = uVar14 >> 8 | uVar14, pcVar12 = (char *)realloc(pcVar8,(uVar14 >> 0x10 | uVar14) + 1),
     pcVar12 != (char *)0x0)) {
    (pcVar12 + local_a0)[0] = '\n';
    (pcVar12 + local_a0)[1] = '\0';
    pcVar8 = pcVar12;
  }
  bcf_hdr_parse(hdr,pcVar8);
  free(pcVar8);
  free(__haystack);
  if (h != (kh_str2int_t *)0x0) {
    free(h->keys);
    free(h->flags);
    free(h->vals);
    free(h);
  }
  return hdr;
}

Assistant:

bcf_hdr_t *bcf_hdr_subset(const bcf_hdr_t *h0, int n, char *const* samples, int *imap)
{
    int hlen;
    void *names_hash = khash_str2int_init();
    char *htxt = bcf_hdr_fmt_text(h0, 1, &hlen);
    kstring_t str;
    bcf_hdr_t *h;
    str.l = str.m = 0; str.s = 0;
    h = bcf_hdr_init("w");
    bcf_hdr_set_version(h,bcf_hdr_get_version(h0));
    int j;
    for (j=0; j<n; j++) imap[j] = -1;
    if ( bcf_hdr_nsamples(h0) > 0) {
        char *p;
        int i = 0, end = n? 8 : 7;
        while ((p = strstr(htxt, "#CHROM\t")) != 0)
            if (p > htxt && *(p-1) == '\n') break;
        while ((p = strchr(p, '\t')) != 0 && i < end) ++i, ++p;
        if (i != end) {
            free(h); free(str.s);
            return 0; // malformated header
        }
        kputsn(htxt, p - htxt, &str);
        for (i = 0; i < n; ++i) {
            if ( khash_str2int_has_key(names_hash,samples[i]) )
            {
                fprintf(stderr,"[E::bcf_hdr_subset] Duplicate sample name \"%s\".\n", samples[i]);
                free(str.s);
                free(htxt);
                khash_str2int_destroy(names_hash);
                bcf_hdr_destroy(h);
                return NULL;
            }
            imap[i] = bcf_hdr_id2int(h0, BCF_DT_SAMPLE, samples[i]);
            if (imap[i] < 0) continue;
            kputc('\t', &str);
            kputs(samples[i], &str);
            khash_str2int_inc(names_hash,samples[i]);
        }
    } else kputsn(htxt, hlen, &str);
    while (str.l && (!str.s[str.l-1] || str.s[str.l-1]=='\n') ) str.l--; // kill trailing zeros and newlines
    kputc('\n',&str);
    bcf_hdr_parse(h, str.s);
    free(str.s);
    free(htxt);
    khash_str2int_destroy(names_hash);
    return h;
}